

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,FunctionStmtBlock *stmt)

{
  undefined1 *puVar1;
  long lVar2;
  long lVar3;
  size_t __first;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  mapped_type *pmVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InternalException *this_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t width;
  Port *port;
  undefined1 *puVar10;
  SystemVerilogCodeGen *pSVar11;
  char *pcVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  key_type *__k;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __i;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  string_view sVar13;
  undefined1 local_100 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ordering;
  shared_ptr<kratos::Var> handler;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ports;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  
  iVar4 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xf])(stmt);
  if ((char)iVar4 == '\0') {
    iVar4 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x10])(stmt);
    if ((char)iVar4 == '\0') {
      if (this->generator_->debug == true) {
        (stmt->super_StmtBlock).super_Stmt.super_IRNode.verilog_ln =
             *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
      }
      iVar4 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x11])(stmt);
      if ((char)iVar4 == '\0') {
        local_98 = (undefined1  [8])&ports._M_t._M_impl.super__Rb_tree_header;
        ports._M_t._M_impl._0_8_ = 0;
        ports._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
        iVar4 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xe])(stmt);
        if ((char)iVar4 == '\0') {
          std::__cxx11::string::assign(local_98);
        }
        else {
          std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                     &ordering._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     &(stmt->function_handler_).
                      super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
          if (ordering._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
            pSVar11 = (SystemVerilogCodeGen *)0x20;
            width = extraout_EDX;
          }
          else {
            uVar5 = (**(code **)(*(long *)ordering._M_t._M_impl.super__Rb_tree_header._M_node_count
                                + 0x38))();
            pSVar11 = (SystemVerilogCodeGen *)(ulong)uVar5;
            width = extraout_EDX_00;
          }
          get_width_str_abi_cxx11_
                    ((string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,pSVar11,width
                    );
          std::operator+(&local_b8,"logic",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,&local_b8," ");
          std::__cxx11::string::operator=((string *)local_98,(string *)local_100);
          std::__cxx11::string::~string((string *)local_100);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string
                    ((string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&handler);
        }
        poVar6 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,
                                 "function ");
        std::operator<<(poVar6,(string *)local_98);
        std::__cxx11::string::~string((string *)local_98);
      }
      else {
        std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,"task ");
      }
      puVar10 = &(this->stream_).super_stringstream.field_0x10;
      std::__cxx11::string::string((string *)local_98,(string *)&stmt->function_name_);
      std::operator<<((ostream *)puVar10,(string *)local_98);
      std::__cxx11::string::~string((string *)local_98);
      if ((stmt->ports_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        poVar6 = std::operator<<((ostream *)puVar10,";");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      else {
        poVar6 = std::operator<<((ostream *)puVar10,"(");
        puVar1 = &(this->stream_).super_stringstream.field_0x90;
        *(long *)puVar1 = *(long *)puVar1 + 1;
        std::operator<<(poVar6,'\n');
      }
      this->indent_ = this->indent_ + 1;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                  *)local_98,&(stmt->ports_)._M_t);
      ports._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,
                (size_type)ports._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  *)local_100,&(stmt->port_ordering_)._M_t);
      for (p_Var7 = ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          __first = ports._M_t._M_impl.super__Rb_tree_header._M_node_count,
          p_Var7 != (_Rb_tree_node_base *)&ports;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &ports._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var7 + 1)
                  );
      }
      if (ordering._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
        if (ordering._M_t._M_impl.super__Rb_tree_header._M_header._M_right !=
            ports._M_t._M_impl.super__Rb_tree_header._M_header._M_right) {
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"Port ordering size mismatches ports",
                     (allocator<char> *)&ordering._M_t._M_impl.super__Rb_tree_header._M_node_count);
          InternalException::InternalException(this_00,&local_b8);
          __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        if (ports._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          lVar3 = -ports._M_t._M_impl.super__Rb_tree_header._M_node_count;
          uVar8 = lVar3 >> 5;
          lVar2 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::FunctionStmtBlock*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )ports._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )0x0,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_codegen_cc:685:57)>
                      )local_100);
          if (lVar3 < 0x201) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::FunctionStmtBlock*)::__0>>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )__first,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )0x0,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_codegen_cc:685:57)>
                              )local_100);
          }
          else {
            __last._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (__first + 0x200);
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::FunctionStmtBlock*)::__0>>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )__first,__last,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_codegen_cc:685:57)>
                        )local_100);
            for (; __last._M_current !=
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                __last._M_current = __last._M_current + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::FunctionStmtBlock*)::__0>>
                        (__last,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_codegen_cc:685:57)>
                                 )local_100);
            }
          }
        }
      }
      handler.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var7 = (_Base_ptr)0x1;
      for (__k = (key_type *)ports._M_t._M_impl.super__Rb_tree_header._M_node_count;
          __k != (key_type *)
                 handler.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi; __k = __k + 1) {
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                 ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                       *)local_98,__k);
        pSVar11 = (SystemVerilogCodeGen *)
                  (pmVar9->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (this->generator_->debug == true) {
          *(undefined4 *)&(pSVar11->empty_indent_str_)._M_string_length =
               *(undefined4 *)&(this->stream_).super_stringstream.field_0x90;
        }
        sVar13 = indent(this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar10,sVar13._M_str,sVar13._M_len);
        get_port_str_abi_cxx11_(&local_b8,pSVar11,port);
        std::operator<<(poVar6,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        pcVar12 = ",";
        poVar6 = (ostream *)puVar10;
        if (p_Var7 == ports._M_t._M_impl.super__Rb_tree_header._M_header._M_right) {
          puVar1 = &(this->stream_).super_stringstream.field_0x90;
          *(long *)puVar1 = *(long *)puVar1 + 1;
          poVar6 = std::operator<<((ostream *)puVar10,'\n');
          pcVar12 = ");";
        }
        poVar6 = std::operator<<(poVar6,pcVar12);
        puVar1 = &(this->stream_).super_stringstream.field_0x90;
        *(long *)puVar1 = *(long *)puVar1 + 1;
        std::operator<<(poVar6,'\n');
        p_Var7 = (_Base_ptr)((long)&p_Var7->_M_color + 1);
      }
      this->indent_ = this->indent_ - 1;
      poVar6 = std::operator<<((ostream *)puVar10,"begin");
      puVar1 = &(this->stream_).super_stringstream.field_0x90;
      *(long *)puVar1 = *(long *)puVar1 + 1;
      std::operator<<(poVar6,'\n');
      this->indent_ = this->indent_ + 1;
      uVar8 = 0;
      while( true ) {
        iVar4 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[1])();
        if (CONCAT44(extraout_var,iVar4) <= uVar8) break;
        iVar4 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[2])(stmt,uVar8);
        (**this->_vptr_SystemVerilogCodeGen)(this,CONCAT44(extraout_var_00,iVar4));
        uVar8 = uVar8 + 1;
      }
      this->indent_ = this->indent_ - 1;
      iVar4 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x11])();
      pcVar12 = "endfunction";
      if ((char)iVar4 != '\0') {
        pcVar12 = "endtask";
      }
      sVar13 = indent(this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar10,sVar13._M_str,sVar13._M_len);
      poVar6 = std::operator<<(poVar6,"end");
      puVar10 = &(this->stream_).super_stringstream.field_0x90;
      *(long *)puVar10 = *(long *)puVar10 + 1;
      poVar6 = std::operator<<(poVar6,'\n');
      poVar6 = std::operator<<(poVar6,pcVar12);
      puVar10 = &(this->stream_).super_stringstream.field_0x90;
      *(long *)puVar10 = *(long *)puVar10 + 1;
      std::operator<<(poVar6,'\n');
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)local_100);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                   *)local_98);
    }
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(kratos::FunctionStmtBlock* stmt) {
    // dpi is external module
    if (stmt->is_dpi() || stmt->is_builtin()) return;
    if (generator_->debug) {
        stmt->verilog_ln = stream_.line_no();
    }
    if (stmt->is_task()) {
        stream_ << "task ";
    } else {
        std::string return_str;
        if (stmt->has_return_value()) {
            auto handler = stmt->function_handler();
            auto width = 32u;
            if (handler) {
                width = handler->width();
            }
            return_str = "logic" + get_width_str(width) + " ";
        } else {
            return_str = "void ";
        }
        stream_ << "function " << return_str;
    }

    stream_ << stmt->function_name();
    if (stmt->ports().empty()) {
        stream_ << ";" << std::endl;
    } else {
        stream_ << "(" << stream_.endl();
    }

    indent_++;
    uint64_t count = 0;
    auto ports = stmt->ports();
    // if the ordering is specified, use the ordering
    // otherwise use the default map ordering, which is sorted alphabetically
    std::vector<std::string> port_names;
    port_names.reserve(ports.size());
    auto ordering = stmt->port_ordering();
    for (auto const& iter : ports) port_names.emplace_back(iter.first);
    if (!ordering.empty()) {
        if (ordering.size() != ports.size())
            throw InternalException("Port ordering size mismatches ports");
        // sort the list
        std::sort(port_names.begin(), port_names.end(), [&](auto const& lhs, auto const& rhs) {
            return ordering.at(lhs) < ordering.at(rhs);
        });
    }
    for (auto const& port_name : port_names) {
        auto* port = ports.at(port_name).get();
        if (generator_->debug) port->verilog_ln = stream_.line_no();
        stream_ << indent() << get_port_str(port);
        if (++count != ports.size())
            stream_ << "," << stream_.endl();
        else
            stream_ << stream_.endl() << ");" << stream_.endl();
    }
    indent_--;

    stream_ << "begin" << stream_.endl();
    indent_++;
    for (uint64_t i = 0; i < stmt->child_count(); i++) {
        dispatch_node(stmt->get_child(i));
    }
    indent_--;
    auto const* end_token = stmt->is_task() ? "endtask" : "endfunction";
    stream_ << indent() << "end" << stream_.endl() << end_token << stream_.endl();
}